

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_value_visit(BinTextReader *this,Embed *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  char *pcVar2;
  char *msg;
  bool end;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71(in_register_00000001,in_AL);
  pcVar2 = (this->reader).cur_;
  bVar1 = TextReader::read_hash_name(&this->reader,&value->name);
  if (!bVar1) {
    bVar1 = fail_msg(this,"reader.read_hash_name(value.name)",pcVar2);
    return bVar1;
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  pcVar2 = (this->reader).cur_;
  bVar1 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&uStack_28 + 7));
  if (bVar1) {
    do {
      if (uStack_28._7_1_ != '\0') {
        return true;
      }
      pcVar2 = (this->reader).cur_;
      bVar1 = read_field(this,&value->items);
      if (!bVar1) {
        msg = "read_field(value.items)";
        goto LAB_0012cbeb;
      }
      pcVar2 = (this->reader).cur_;
      bVar1 = TextReader::read_nested_separator_or_end(&this->reader,(bool *)((long)&uStack_28 + 7))
      ;
    } while (bVar1);
    msg = "reader.read_nested_separator_or_end(end)";
  }
  else {
    msg = "reader.read_nested_begin(end)";
  }
LAB_0012cbeb:
  bVar1 = fail_msg(this,msg,pcVar2);
  return bVar1;
}

Assistant:

bool read_value_visit(Embed& value) noexcept {
            bin_assert(reader.read_hash_name(value.name));
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(read_field(value.items));
                bin_assert(reader.read_nested_separator_or_end(end));
            }
            return true;
        }